

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

void stbiw__write_pixels(stbi__write_context *s,int rgb_dir,int vdir,int x,int y,int comp,void *data
                        ,int write_alpha,int scanline_pad,int expand_mono)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  int in_R8D;
  int in_R9D;
  uchar *d;
  int j_end;
  int j;
  int i;
  stbiw_uint32 zero;
  int local_2c;
  int iVar2;
  int expand_mono_00;
  
  expand_mono_00 = 0;
  if (0 < in_R8D) {
    if (stbi__flip_vertically_on_write != 0) {
      in_EDX = -in_EDX;
    }
    if (in_EDX < 0) {
      local_2c = -1;
      iVar1 = in_R8D + -1;
    }
    else {
      iVar1 = 0;
      local_2c = in_R8D;
    }
    for (; iVar1 != local_2c; iVar1 = in_EDX + iVar1) {
      for (iVar2 = 0; iVar2 < in_ECX; iVar2 = iVar2 + 1) {
        stbiw__write_pixel((stbi__write_context *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,in_R9D,
                           expand_mono_00,(uchar *)CONCAT44(iVar2,iVar1));
      }
      stbiw__write_flush((stbi__write_context *)0x4599cb);
      (*(code *)*in_RDI)(in_RDI[1],&stack0xffffffffffffffe0,zero);
    }
  }
  return;
}

Assistant:

static void stbiw__write_pixels(stbi__write_context *s, int rgb_dir, int vdir, int x, int y, int comp, void *data, int write_alpha, int scanline_pad, int expand_mono)
{
   stbiw_uint32 zero = 0;
   int i,j, j_end;

   if (y <= 0)
      return;

   if (stbi__flip_vertically_on_write)
      vdir *= -1;

   if (vdir < 0) {
      j_end = -1; j = y-1;
   } else {
      j_end =  y; j = 0;
   }

   for (; j != j_end; j += vdir) {
      for (i=0; i < x; ++i) {
         unsigned char *d = (unsigned char *) data + (j*x+i)*comp;
         stbiw__write_pixel(s, rgb_dir, comp, write_alpha, expand_mono, d);
      }
      stbiw__write_flush(s);
      s->func(s->context, &zero, scanline_pad);
   }
}